

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void writeBits(LodePNGBitWriter *writer,uint value,size_t nbits)

{
  byte *pbVar1;
  ucvector *puVar2;
  uint uVar3;
  size_t i;
  size_t sVar4;
  
  if (nbits != 0) {
    if (nbits == 1) {
      if ((writer->bp & 7) == 0) {
        puVar2 = writer->data;
        uVar3 = ucvector_resize(puVar2,puVar2->size + 1);
        if (uVar3 != 0) {
          puVar2->data[puVar2->size - 1] = '\0';
        }
      }
      pbVar1 = writer->data->data + (writer->data->size - 1);
      *pbVar1 = *pbVar1 | (byte)(value << ((byte)writer->bp & 7));
      writer->bp = writer->bp + 1;
    }
    else {
      sVar4 = 0;
      do {
        if ((writer->bp & 7) == 0) {
          puVar2 = writer->data;
          uVar3 = ucvector_resize(puVar2,puVar2->size + 1);
          if (uVar3 != 0) {
            puVar2->data[puVar2->size - 1] = '\0';
          }
        }
        pbVar1 = writer->data->data + (writer->data->size - 1);
        *pbVar1 = *pbVar1 | ((value >> ((uint)sVar4 & 0x1f) & 1) != 0) << ((byte)writer->bp & 7);
        writer->bp = writer->bp + 1;
        sVar4 = sVar4 + 1;
      } while (nbits != sVar4);
    }
  }
  return;
}

Assistant:

static void writeBits(LodePNGBitWriter* writer, unsigned value, size_t nbits) {
  if(nbits == 1) { /* compiler should statically compile this case if nbits == 1 */
    WRITEBIT(writer, value);
  } else {
    /* TODO: increase output size nly once here rather than in each WRITEBIT */
    size_t i;
    for(i = 0; i != nbits; ++i) {
      WRITEBIT(writer, (unsigned char)((value >> i) & 1));
    }
  }
}